

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfg_tobin.c
# Opt level: O3

int cfg_tobin_choice(void *reference,size_t bin_size,const_strarray *value,
                    _func_char_ptr_size_t_void_ptr *callback,size_t choices_count,void *ptr)

{
  int iVar1;
  
  iVar1 = -1;
  if (bin_size == 4) {
    iVar1 = cfg_get_choice_index(value->value,callback,choices_count,ptr);
    *(int *)reference = iVar1;
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int
cfg_tobin_choice(void *reference, size_t bin_size, const struct const_strarray *value,
  const char *(*callback)(size_t idx, const void *ptr), size_t choices_count, const void *ptr) {
  int *result;

  if (bin_size != sizeof(int)) {
    return -1;
  }

  result = (int *)reference;

  *result = cfg_get_choice_index(strarray_get_first_c(value), callback, choices_count, ptr);
  return 0;
}